

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O3

void __thiscall kj::GzipOutputStream::pump(GzipOutputStream *this,int flush)

{
  TupleElement<0U,_bool> TVar1;
  Tuple<bool,_kj::ArrayPtr<const_byte>_> result;
  Tuple<bool,_kj::ArrayPtr<const_byte>_> local_40;
  
  do {
    kj::_::GzipOutputContext::pumpOnce(&local_40,&this->ctx,flush);
    TVar1.value = local_40.impl.super_TupleElement<0U,_bool>.value;
    if (local_40.impl.super_TupleElement<1U,_kj::ArrayPtr<const_unsigned_char>_>.value.size_ != 0) {
      (*this->inner->_vptr_OutputStream[2])
                (this->inner,
                 local_40.impl.super_TupleElement<1U,_kj::ArrayPtr<const_unsigned_char>_>.value.ptr)
      ;
    }
  } while (TVar1.value != false);
  return;
}

Assistant:

void GzipOutputStream::pump(int flush) {
  bool ok;
  do {
    auto result = ctx.pumpOnce(flush);
    ok = get<0>(result);
    auto chunk = get<1>(result);
    if (chunk.size() > 0) {
      inner.write(chunk);
    }
  } while (ok);
}